

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall
ASDCP::MXF::IABEssenceDescriptor::IABEssenceDescriptor(IABEssenceDescriptor *this,Dictionary *d)

{
  byte_t *value;
  UL local_38;
  Dictionary *local_18;
  Dictionary *d_local;
  IABEssenceDescriptor *this_local;
  
  local_18 = d;
  d_local = (Dictionary *)this;
  GenericSoundEssenceDescriptor::GenericSoundEssenceDescriptor
            (&this->super_GenericSoundEssenceDescriptor,d);
  (this->super_GenericSoundEssenceDescriptor).super_FileDescriptor.super_GenericDescriptor.
  super_InterchangeObject.super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__IABEssenceDescriptor_0033bea8;
  if ((this->super_GenericSoundEssenceDescriptor).super_FileDescriptor.super_GenericDescriptor.
      super_InterchangeObject.m_Dict != (Dictionary *)0x0) {
    value = Dictionary::ul((this->super_GenericSoundEssenceDescriptor).super_FileDescriptor.
                           super_GenericDescriptor.super_InterchangeObject.m_Dict,
                           MDD_IABEssenceDescriptor);
    UL::UL(&local_38,value);
    UL::operator=(&(this->super_GenericSoundEssenceDescriptor).super_FileDescriptor.
                   super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.m_UL,&local_38);
    UL::~UL(&local_38);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x1453,"ASDCP::MXF::IABEssenceDescriptor::IABEssenceDescriptor(const Dictionary *)"
               );
}

Assistant:

IABEssenceDescriptor::IABEssenceDescriptor(const Dictionary* d) : GenericSoundEssenceDescriptor(d)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_IABEssenceDescriptor);
}